

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDSketch.cpp
# Opt level: O1

longlong LDSketch_up_estimate(LDSketch_t *sk,uchar *key)

{
  uint uVar1;
  longlong lVar2;
  longlong lVar3;
  int iVar4;
  int row_no;
  
  uVar1 = LDSketch_find(sk,key,0,sk->lgn + -1,0);
  lVar2 = dyn_tbl_up_estimate(sk->tbl[(int)uVar1],key);
  if (1 < sk->h) {
    row_no = 1;
    do {
      uVar1 = LDSketch_find(sk,key,0,sk->lgn + -1,row_no);
      iVar4 = sk->w * row_no + uVar1;
      lVar3 = dyn_tbl_up_estimate(sk->tbl[iVar4],key);
      if (lVar3 <= lVar2) {
        lVar2 = dyn_tbl_up_estimate(sk->tbl[iVar4],key);
      }
      row_no = row_no + 1;
    } while (row_no < sk->h);
  }
  return lVar2;
}

Assistant:

long long LDSketch_up_estimate(LDSketch_t* sk, unsigned char* key) {
	int k = LDSketch_find(sk, key, 0, sk->lgn - 1, 0);
	long long ret = dyn_tbl_up_estimate(sk->tbl[k], key);
	for (int i = 1; i < sk->h; ++i) {
		k = LDSketch_find(sk, key, 0, sk->lgn - 1, i);
		int index = i * sk->w + k;
		ret = MIN(ret, dyn_tbl_up_estimate(sk->tbl[index], key));
	}
	return ret;
}